

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.c++
# Opt level: O3

void __thiscall kj::AtomicRefcounted::disposeImpl(AtomicRefcounted *this,void *pointer)

{
  uint *puVar1;
  
  LOCK();
  puVar1 = &this->refcount;
  *puVar1 = *puVar1 - 1;
  UNLOCK();
  if (*puVar1 == 0) {
    (*(this->super_Disposer)._vptr_Disposer[2])();
    return;
  }
  return;
}

Assistant:

void AtomicRefcounted::disposeImpl(void* pointer) const {
#if _MSC_VER
  if (KJ_MSVC_INTERLOCKED(Decrement, rel)(&refcount) == 0) {
    std::atomic_thread_fence(std::memory_order_acquire);
    delete this;
  }
#else
  if (__atomic_sub_fetch(&refcount, 1, __ATOMIC_RELEASE) == 0) {
    __atomic_thread_fence(__ATOMIC_ACQUIRE);
    delete this;
  }
#endif
}